

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_Mesh::SetTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  TYPE TVar1;
  int iVar2;
  ON_2fPoint *pOVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ON_Xform *pOVar9;
  ON_Xform *pOVar10;
  int *Tsd;
  ON_SimpleArray<int> *Tside_00;
  long lVar11;
  byte bVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ON_SimpleArray<int> Tside;
  ON_3dPoint T;
  ON_TextureMapping mp;
  double local_2b8;
  ON_SimpleArray<int> local_2b0;
  ON_3dPoint local_298;
  ON_Xform *local_280;
  ON_3dPoint local_278;
  ON_TextureMapping local_260;
  
  bVar12 = 0;
  TVar1 = mapping->m_type;
  if ((TVar1 != srfp_mapping) &&
     (((((mapping->m_projection == ray_projection || (TVar1 == wcsbox_projection)) ||
        (TVar1 == box_mapping)) || ((TVar1 == cylinder_mapping && (mapping->m_bCapped != false))))
      && (bVar4 = HasVertexNormals(this), !bVar4)))) {
    ComputeVertexNormals(this);
  }
  InvalidateTextureCoordinateBoundingBox(this);
  local_2b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  local_2b0.m_a = (int *)0x0;
  local_2b0.m_count = 0;
  local_2b0.m_capacity = 0;
  ON_TextureMapping::ON_TextureMapping(&local_260,mapping);
  if (!bSeamCheck) {
    local_2b8 = 1.0;
    Tside_00 = (ON_SimpleArray<int> *)0x0;
    goto LAB_004e62e9;
  }
  local_2b8 = 1.0;
  if (local_260.m_type == cylinder_mapping) {
    if (local_260.m_texture_space == divided) {
      local_2b8 = 0.6666666666666666;
      goto LAB_004e628a;
    }
LAB_004e6276:
    bVar4 = true;
    Tside_00 = (ON_SimpleArray<int> *)0x0;
  }
  else {
    if (local_260.m_type == sphere_mapping) goto LAB_004e6276;
    if (local_260.m_type == box_mapping) {
      if (local_260.m_texture_space != single) {
        if (local_260.m_texture_space != divided) goto LAB_004e6250;
        if (local_260.m_bCapped == false) {
          uVar13 = 0;
          uVar14 = 0x3ff00000;
        }
        else {
          uVar13 = 0x55555555;
          uVar14 = 0x3fe55555;
        }
        local_2b8 = (double)CONCAT44(uVar14,uVar13);
      }
LAB_004e628a:
      bVar4 = true;
      Tside_00 = &local_2b0;
    }
    else {
LAB_004e6250:
      Tside_00 = (ON_SimpleArray<int> *)0x0;
      bVar4 = false;
    }
  }
  if (bVar4) {
    iVar2 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    local_280 = mesh_xform;
    iVar6 = TriangleCount(this);
    iVar7 = QuadCount(this);
    bSeamCheck = iVar2 < iVar6 * 3 + iVar7 * 4;
    mesh_xform = local_280;
  }
  else {
    bSeamCheck = false;
  }
  if (bSeamCheck != false) {
    pOVar9 = &ON_Xform::IdentityTransformation;
    pOVar10 = &local_260.m_uvw;
    for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
      pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
      pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      pOVar10 = (ON_Xform *)((long)pOVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    }
  }
LAB_004e62e9:
  bVar4 = ON_TextureMapping::GetTextureCoordinates
                    (&local_260,this,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,mesh_xform,bLazy,
                     Tside_00);
  if (Tside_00 != (ON_SimpleArray<int> *)0x0) {
    bSeamCheck = (bool)(bSeamCheck & Tside_00->m_count != 0);
  }
  if (bVar4) {
    ON_MappingTag::Set(&this->m_Ttag,mapping);
    if (((mesh_xform != (ON_Xform *)0x0) && (bVar5 = ON_Xform::IsValid(mesh_xform), bVar5)) &&
       ((bVar5 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar5 &&
        (bVar5 = ON_Xform::IsZero(mesh_xform), !bVar5)))) {
      pOVar9 = mesh_xform;
      pOVar10 = &(this->m_Ttag).m_mesh_xform;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar12 * -0x10 + 8);
      }
    }
    if (((bSeamCheck & bVar4) == 1) &&
       (bVar5 = HasTextureCoordinates(this), bVar5 && 0 < (this->m_F).m_count)) {
      Tsd = local_2b0.m_a;
      if (local_2b0.m_count != (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count) {
        Tsd = (int *)0x0;
      }
      if (Tside_00 == (ON_SimpleArray<int> *)0x0) {
        Tsd = (int *)0x0;
      }
      AdjustMeshPeriodicTextureCoordinatesHelper
                (this,mesh_xform,&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x,2,Tsd,
                 local_2b8,&local_260);
      pOVar9 = &mapping->m_uvw;
      bVar5 = ON_Xform::IsIdentity(pOVar9,0.0);
      if (((!bVar5) && (bVar5 = ON_Xform::IsZero(pOVar9), !bVar5)) &&
         (lVar8 = (long)(this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count, 0 < lVar8)) {
        pOVar3 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
        lVar11 = 0;
        do {
          local_298.x = (double)pOVar3[lVar11].x;
          local_298.y = (double)pOVar3[lVar11].y;
          local_298.z = 0.0;
          ON_Xform::operator*(&local_278,pOVar9,&local_298);
          local_298.z = local_278.z;
          local_298.x = local_278.x;
          local_298.y = local_278.y;
          pOVar3[lVar11].x = (float)local_278.x;
          pOVar3[lVar11].y = (float)local_278.y;
          lVar11 = lVar11 + 1;
        } while (lVar8 != lVar11);
      }
    }
  }
  ON_TextureMapping::~ON_TextureMapping(&local_260);
  ON_SimpleArray<int>::~ON_SimpleArray(&local_2b0);
  return bVar4;
}

Assistant:

bool ON_Mesh::SetTextureCoordinatesEx(
                  const class ON_TextureMapping& mapping,
                  const class ON_Xform* mesh_xform,
                  bool bLazy,
                  bool bSeamCheck
                  )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  InvalidateTextureCoordinateBoundingBox();

  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;
  ON_TextureMapping mp = mapping;

  double two_pi_tc = 1.0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  bool rc = mp.GetTextureCoordinates(*this,m_T,mesh_xform,bLazy,Tsd);

  if (Tsd != nullptr && Tsd->Count() == 0)
  {
    // Tsd array is needed for seam check but it was not filled by GetTextureCoordinates.
    // This happened because matching texture coordinates were found. These coordinates
    // were already once seam checked. So seam check can be skipped now.
    bSeamCheck = false;
  }

  if (rc)
  {
    // update the texture coordinate tag
    m_Ttag.Set(mapping);
    if (    mesh_xform
         && mesh_xform->IsValid()
         && !mesh_xform->IsIdentity()
         && !mesh_xform->IsZero()
       )
    {
      m_Ttag.m_mesh_xform  = *mesh_xform;
    }
  }

  if ( rc && bSeamCheck && HasTextureCoordinates() && m_F.Count() > 0 )
  {
    float* mesh_T = (float*)m_T.Array();
    int mesh_T_stride = sizeof(m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_2fPoint* meshT = m_T.Array();
      ON_3dPoint T;
      int vi, vcnt = m_T.Count();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T.x = meshT[vi].x;
        T.y = meshT[vi].y;
        T.z = 0.0;
        T = mapping.m_uvw*T;
        meshT[vi].x = (float)T.x;
        meshT[vi].y = (float)T.y;
      }
    }
  }

  return rc;
}